

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O0

R_conflict QChar::fromUcs4(char32_t c)

{
  long lVar1;
  bool bVar2;
  R_conflict RVar3;
  char32_t in_EDI;
  long in_FS_OFFSET;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = requiresSurrogates(in_EDI);
  if (bVar2) {
    local_c._0_2_ = highSurrogate(in_EDI);
    local_c._2_2_ = lowSurrogate(in_EDI);
  }
  else {
    local_c = (char16_t  [2])(in_EDI & 0xffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    RVar3.chars[0] = (char16_t)local_c;
    RVar3.chars[1] = local_c._2_2_;
    return (R_conflict)RVar3.chars;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] constexpr auto QChar::fromUcs4(char32_t c) noexcept
{
    struct R {
        char16_t chars[2];
        [[nodiscard]] constexpr operator QStringView() const noexcept { return {begin(), end()}; }
        [[nodiscard]] constexpr qsizetype size() const noexcept { return chars[1] ? 2 : 1; }
        [[nodiscard]] constexpr const char16_t *begin() const noexcept { return chars; }
        [[nodiscard]] constexpr const char16_t *end() const noexcept { return begin() + size(); }
    };
    return requiresSurrogates(c) ? R{{QChar::highSurrogate(c),
                                      QChar::lowSurrogate(c)}} :
                                   R{{char16_t(c), u'\0'}} ;
}